

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Ntk_t * Abc_SclUnBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Abc_Obj_t *pFanin_00;
  Abc_Ntk_t *pNtk_00;
  int local_4c;
  uint local_48;
  int Total;
  int Counter;
  int iLit;
  int k;
  int i;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  local_48 = 0;
  local_4c = 0;
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    pVVar4 = Vec_IntStart(iVar1);
    pNtk->vPhases = pVVar4;
    for (iLit = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), iLit < iVar1; iLit = iLit + 1) {
      pObj_00 = Abc_NtkObj(pNtk,iLit);
      if ((pObj_00 != (Abc_Obj_t *)0x0) &&
         (((iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0 || (iVar1 = Abc_ObjIsCo(pObj_00), iVar1 != 0)
           ) && (iVar1 = Abc_SclObjIsBufInv(pObj_00), iVar1 == 0)))) {
        for (Counter = 0; iVar1 = Abc_ObjFaninNum(pObj_00), Counter < iVar1; Counter = Counter + 1)
        {
          pObj_01 = Abc_ObjFanin(pObj_00,Counter);
          local_4c = local_4c + 1;
          iVar1 = Abc_SclGetRealFaninLit(pObj_01);
          iVar2 = Abc_Lit2Var(iVar1);
          pFanin_00 = Abc_NtkObj(pNtk,iVar2);
          if ((pFanin_00 != pObj_01) && (iVar2 = Abc_NodeFindFanin(pObj_00,pFanin_00), iVar2 < 0)) {
            Abc_ObjPatchFanin(pObj_00,pObj_01,pFanin_00);
            iVar1 = Abc_LitIsCompl(iVar1);
            if (iVar1 != 0) {
              Abc_ObjFaninFlipPhase(pObj_00,Counter);
              local_48 = local_48 + 1;
            }
          }
        }
      }
    }
    if (fVerbose != 0) {
      printf("Saved %d (%.2f %%) fanin phase bits.  ",
             ((double)(int)local_48 * 100.0) / (double)local_4c,(ulong)local_48);
    }
    pNtk_00 = Abc_NtkDupDfs(pNtk);
    if (fVerbose != 0) {
      uVar3 = Abc_SclCountMaxPhases(pNtk_00);
      printf("Max depth = %d.\n",(ulong)uVar3);
    }
    Abc_SclReportDupFanins(pNtk_00);
    return pNtk_00;
  }
  __assert_fail("pNtk->vPhases == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0xf4,"Abc_Ntk_t *Abc_SclUnBufferPhase(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, Counter = 0, Total = 0;
    assert( pNtk->vPhases == NULL );
    pNtk->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( Abc_SclObjIsBufInv(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( pFaninNew == pFanin )
                continue;
            // skip fanins which are already fanins of the node
            if ( Abc_NodeFindFanin( pObj, pFaninNew ) >= 0 )
                continue;
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            if ( Abc_LitIsCompl(iLit) )
                Abc_ObjFaninFlipPhase( pObj, k ), Counter++;
        }
    }
    if ( fVerbose )
        printf( "Saved %d (%.2f %%) fanin phase bits.  ", Counter, 100.0 * Counter / Total );
    // duplicate network in topo order
    pNtkNew = Abc_NtkDupDfs( pNtk );
    if ( fVerbose )
        printf( "Max depth = %d.\n", Abc_SclCountMaxPhases(pNtkNew) );
    Abc_SclReportDupFanins( pNtkNew );
    return pNtkNew;
}